

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int generate_code(string *language,string *input_file_path,string *out_path)

{
  t_program *this;
  uint uVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generator_strings;
  string local_e8;
  string local_c8;
  string input_file;
  time_t now;
  string old_input_file;
  string new_thrift_include_path;
  string old_thrift_include_path;
  
  now = time((time_t *)0x0);
  g_time_str = ctime(&now);
  generator_strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  old_thrift_include_path._M_dataplus._M_p = (pointer)&old_thrift_include_path.field_2;
  old_thrift_include_path._M_string_length = 0;
  old_thrift_include_path.field_2._M_local_buf[0] = '\0';
  new_thrift_include_path._M_dataplus._M_p = (pointer)&new_thrift_include_path.field_2;
  new_thrift_include_path._M_string_length = 0;
  generator_strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  generator_strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  new_thrift_include_path.field_2._M_local_buf[0] = '\0';
  old_input_file._M_dataplus._M_p = (pointer)&old_input_file.field_2;
  old_input_file._M_string_length = 0;
  old_input_file.field_2._M_local_buf[0] = '\0';
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&generator_strings
             ,language);
  initGlobals();
  std::__cxx11::string::string((string *)&input_file,(string *)input_file_path);
  this = (t_program *)operator_new(0x238);
  std::__cxx11::string::string((string *)&local_c8,(string *)&input_file);
  t_program::t_program(this,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (out_path->_M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_e8,(string *)out_path);
    t_program::set_out_path(this,&local_e8,false);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  parse(this,(t_program *)0x0);
  std::__cxx11::string::assign((char *)&g_curpath_abi_cxx11_);
  yylineno = 1;
  generate(this,&generator_strings);
  (*(this->super_t_doc)._vptr_t_doc[1])(this);
  clearGlobals();
  if ((g_return_failure == true) && (g_audit_fatal != false)) {
    uVar1 = 1;
  }
  else {
    uVar1 = (uint)g_generator_failure;
  }
  std::__cxx11::string::~string((string *)&input_file);
  std::__cxx11::string::~string((string *)&old_input_file);
  std::__cxx11::string::~string((string *)&new_thrift_include_path);
  std::__cxx11::string::~string((string *)&old_thrift_include_path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&generator_strings);
  return uVar1;
}

Assistant:

int generate_code(string language, string input_file_path, string out_path) {
    int i;
//    std::string out_path;
//    out_path = "/Users/hezhaozhao/akulaku/test/thrift/compiler/cpp";
    bool out_path_is_absolute = false;

    // Setup time string
    time_t now = time(nullptr);
    g_time_str = ctime(&now);

    // Check for necessary arguments, you gotta have at least a filename and
    // an output language flag
    vector<string> generator_strings;
    string old_thrift_include_path;
    string new_thrift_include_path;
    string old_input_file;
//    std:string aa = "py";
    generator_strings.emplace_back(language);
    initGlobals();
//    string input_file_path = "/Users/hezhaozhao/akulaku/test/thrift/compiler/cpp/text1.thrift";
    string input_file(input_file_path); // start

    // Instance of the global parse tree
    t_program *program = new t_program(input_file);
    if (out_path.size()) {
        program->set_out_path(out_path, out_path_is_absolute);
    }

    // Compute the cpp include prefix.
    // infer this from the filename passed in
//    string input_filename = argv[i];
//    string include_prefix;
//
//    string::size_type last_slash = string::npos;
//    if ((last_slash = input_filename.rfind("/")) != string::npos) {
//        include_prefix = input_filename.substr(0, last_slash);
//    }
//
//    program->set_include_prefix(include_prefix);

    // Parse it!
    parse(program, nullptr);

    // The current path is not really relevant when we are doing generation.
    // Reset the variable to make warning messages clearer.
    g_curpath = "generation";
    // Reset yylineno for the heck of it.  Use 1 instead of 0 because
    // That is what shows up during argument parsing.
    yylineno = 1;

    // Generate it!
    generate(program, generator_strings);
    delete program;

    clearGlobals();

    // Finished
    if (g_return_failure && g_audit_fatal) {
        return 1;
    }
    if (g_generator_failure) {
        return 1;
    }
    // Finished
    return 0;
}